

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagged_union.hpp
# Opt level: O3

void type_safe::detail::
     with_union<type_safe::detail::move_union<type_safe::tagged_union<int,double,debugger_type>>::visitor&&,type_safe::tagged_union<int,double,debugger_type>&&,type_safe::union_types<int,double,debugger_type>,type_safe::tagged_union<int,double,debugger_type>&>
     ::with_impl<double,debugger_type>
               (tagged_union<int,_double,_debugger_type> *param_1,undefined8 param_2,
               undefined8 *param_3)

{
  unsigned_long uVar1;
  
  uVar1 = (param_1->cur_type_).
          super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
          .value_;
  if (uVar1 == 3) {
    tagged_union<int,_double,_debugger_type>::check<debugger_type>(param_1);
    *(undefined4 *)param_3 = *(undefined4 *)(param_1->storage_).storage_;
    *(undefined4 *)((long)param_3 + 4) = 0;
    *(undefined2 *)(param_3 + 1) = 0;
    *(undefined2 *)((long)param_3 + 4) = 0x101;
  }
  else {
    if (uVar1 != 2) {
      return;
    }
    tagged_union<int,_double,_debugger_type>::check<double>(param_1);
    *param_3 = *(undefined8 *)(param_1->storage_).storage_;
  }
  param_3[2] = uVar1;
  return;
}

Assistant:

static void with_impl(union_types<Head, Tail...>, Union&& u, Func&& func, Args&&... args)
        {
            if (u.type() == union_type<Head>{})
                call<Head>(0, std::forward<Union>(u), std::forward<Func>(func),
                           std::forward<Args>(args)...);
            else
                with_impl(union_types<Tail...>{}, std::forward<Union>(u), std::forward<Func>(func),
                          std::forward<Args>(args)...);
        }